

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * waitfornewblock(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff798;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff7a0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d0;
  UniValue *in_stack_fffffffffffff7d8;
  iterator in_stack_fffffffffffff7e0;
  RPCArgOptions *in_stack_fffffffffffff7e8;
  string *in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff800;
  RPCHelpMan *pRVar1;
  string *in_stack_fffffffffffff808;
  RPCHelpMan *pRVar2;
  RPCArg *in_stack_fffffffffffff810;
  RPCResults *in_stack_fffffffffffff818;
  RPCResult *in_stack_fffffffffffff820;
  vector<RPCArg,_std::allocator<RPCArg>_> *pvVar3;
  pointer *local_7d8;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 uVar4;
  RPCResults *results;
  string *description;
  undefined7 in_stack_fffffffffffff900;
  undefined1 uVar5;
  allocator<char> local_69d;
  allocator<char> local_69c;
  allocator<char> local_69b;
  allocator<char> local_69a [2];
  pointer local_698;
  pointer pRStack_690;
  pointer local_688;
  allocator<char> local_67a;
  allocator<char> local_679 [39];
  allocator<char> local_652;
  allocator<char> local_651 [31];
  allocator<char> local_632;
  allocator<char> local_631 [32];
  allocator<char> local_611;
  undefined1 local_610 [16];
  RPCMethodImpl *in_stack_fffffffffffffa00;
  allocator<char> local_5ea;
  allocator<char> local_5e9 [385];
  vector<RPCArg,_std::allocator<RPCArg>_> local_468 [5];
  RPCResults local_3e0 [5];
  pointer local_358 [25];
  undefined1 local_290;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined1 local_24f;
  RPCHelpMan local_150;
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  pRVar2 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  local_610._0_4_ = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  local_290 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff7b0);
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff798);
  local_250 = 0;
  local_24f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                 (Type)((ulong)in_stack_fffffffffffff800 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                 in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  uVar5 = 0;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff798);
  __l._M_len = (size_type)in_stack_fffffffffffff7e8;
  __l._M_array = in_stack_fffffffffffff7e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7d8,__l,
             (allocator_type *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  local_679[1] = (allocator<char>)0x0;
  local_679[2] = (allocator<char>)0x0;
  local_679[3] = (allocator<char>)0x0;
  local_679[4] = (allocator<char>)0x0;
  local_679[5] = (allocator<char>)0x0;
  local_679[6] = (allocator<char>)0x0;
  local_679[7] = (allocator<char>)0x0;
  local_679[8] = (allocator<char>)0x0;
  local_679[9] = (allocator<char>)0x0;
  local_679[10] = (allocator<char>)0x0;
  local_679[0xb] = (allocator<char>)0x0;
  local_679[0xc] = (allocator<char>)0x0;
  local_679[0xd] = (allocator<char>)0x0;
  local_679[0xe] = (allocator<char>)0x0;
  local_679[0xf] = (allocator<char>)0x0;
  local_679[0x10] = (allocator<char>)0x0;
  local_679[0x11] = (allocator<char>)0x0;
  local_679[0x12] = (allocator<char>)0x0;
  local_679[0x13] = (allocator<char>)0x0;
  local_679[0x14] = (allocator<char>)0x0;
  local_679[0x15] = (allocator<char>)0x0;
  local_679[0x16] = (allocator<char>)0x0;
  local_679[0x17] = (allocator<char>)0x0;
  local_679[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff798);
  RPCResult::RPCResult
            (in_stack_fffffffffffff820,(Type)((ulong)in_stack_fffffffffffff818 >> 0x20),
             &in_stack_fffffffffffff810->m_names,in_stack_fffffffffffff808,in_stack_fffffffffffff800
             ,(bool)in_stack_fffffffffffff7ff);
  results = local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  local_698 = (pointer)0x0;
  pRStack_690 = (pointer)0x0;
  local_688 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff798);
  RPCResult::RPCResult
            (in_stack_fffffffffffff820,(Type)((ulong)in_stack_fffffffffffff818 >> 0x20),
             &in_stack_fffffffffffff810->m_names,in_stack_fffffffffffff808,in_stack_fffffffffffff800
             ,(bool)in_stack_fffffffffffff7ff);
  uVar4 = 0;
  pvVar3 = local_468;
  description = (string *)0x2;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff798);
  __l_00._M_len = (size_type)in_stack_fffffffffffff7e8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff7e0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7d8,__l_00,
             (allocator_type *)in_stack_fffffffffffff7d0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff820,(Type)((ulong)in_stack_fffffffffffff818 >> 0x20),
             &in_stack_fffffffffffff810->m_names,in_stack_fffffffffffff808,in_stack_fffffffffffff800
             ,(bool)in_stack_fffffffffffff7ff);
  RPCResults::RPCResults(in_stack_fffffffffffff818,(RPCResult *)in_stack_fffffffffffff810);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  HelpExampleCli(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  HelpExampleRpc(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator+(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff798,(string *)0x129f0f9);
  this = (RPCArg *)&stack0xfffffffffffff940;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<waitfornewblock()::__0,void>
            (in_stack_fffffffffffff7a8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff7a0);
  RPCHelpMan::RPCHelpMan
            (pRVar2,(string *)CONCAT17(uVar5,in_stack_fffffffffffff900),description,pvVar3,results,
             (RPCExamples *)CONCAT17(uVar4,in_stack_fffffffffffff8e0),in_stack_fffffffffffffa00);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_69d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_69c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_69b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_69a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  pvVar3 = local_468;
  local_7d8 = local_358;
  do {
    local_7d8 = local_7d8 + -0x11;
    RPCResult::~RPCResult((RPCResult *)this);
  } while ((vector<RPCArg,_std::allocator<RPCArg>_> *)local_7d8 != pvVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_67a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_679);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_652);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_651);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_632);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_631);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  pRVar2 = &local_150;
  pRVar1 = (RPCHelpMan *)&stack0xffffffffffffffb8;
  do {
    pRVar1 = (RPCHelpMan *)
             &pRVar1[-2].m_args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
              super__Vector_impl_data._M_finish;
    RPCArg::~RPCArg(this);
  } while (pRVar1 != pRVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_611);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_610 + 7));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_5ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_5e9);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8._M_p) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan waitfornewblock()
{
    return RPCHelpMan{"waitfornewblock",
                "\nWaits for any new block and returns useful info about it.\n"
                "\nReturns the current block on timeout or exit.\n"
                "\nMake sure to use no RPC timeout (bitcoin-cli -rpcclienttimeout=0)",
                {
                    {"timeout", RPCArg::Type::NUM, RPCArg::Default{0}, "Time in milliseconds to wait for a response. 0 indicates no timeout."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "hash", "The blockhash"},
                        {RPCResult::Type::NUM, "height", "Block height"},
                    }},
                RPCExamples{
                    HelpExampleCli("waitfornewblock", "1000")
            + HelpExampleRpc("waitfornewblock", "1000")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    int timeout = 0;
    if (!request.params[0].isNull())
        timeout = request.params[0].getInt<int>();
    if (timeout < 0) throw JSONRPCError(RPC_MISC_ERROR, "Negative timeout");

    NodeContext& node = EnsureAnyNodeContext(request.context);
    Mining& miner = EnsureMining(node);

    auto block{CHECK_NONFATAL(miner.getTip()).value()};
    if (IsRPCRunning()) {
        block = timeout ? miner.waitTipChanged(block.hash, std::chrono::milliseconds(timeout)) : miner.waitTipChanged(block.hash);
    }

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("hash", block.hash.GetHex());
    ret.pushKV("height", block.height);
    return ret;
},
    };
}